

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

bool QFileSystemEngine::fillMetaData
               (QFileSystemEntry *entry,QFileSystemMetaData *data,MetaDataFlags what)

{
  bool bVar1;
  QFlags<QFileSystemMetaData::MetaDataFlag> QVar2;
  int iVar3;
  MetaDataFlags MVar4;
  char *pcVar5;
  int *piVar6;
  QFlags<QFileSystemMetaData::MetaDataFlag> *in_RSI;
  long in_FS_OFFSET;
  mode_t mode;
  int statResult;
  QString fileName;
  anon_class_32_4_8c4370f3 checkAccess;
  int entryErrno;
  QByteArray nativeFilePath;
  stat64 statBuffer;
  undefined4 in_stack_fffffffffffffd68;
  MetaDataFlag in_stack_fffffffffffffd6c;
  enum_type in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd74;
  undefined1 in_stack_fffffffffffffd75;
  undefined1 in_stack_fffffffffffffd76;
  undefined1 in_stack_fffffffffffffd77;
  byte bVar7;
  statx *in_stack_fffffffffffffd78;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> flags;
  QFileSystemMetaData *in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd88;
  undefined2 in_stack_fffffffffffffd8c;
  QChar in_stack_fffffffffffffd8e;
  QFileSystemMetaData *in_stack_fffffffffffffd90;
  bool local_261;
  uint local_204;
  int local_200;
  bool local_1e1;
  QChar local_1da;
  undefined1 *local_1d8;
  undefined1 *puStack_1d0;
  undefined1 *local_1c8;
  QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4> local_1b4;
  QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4> local_1b0;
  CompareAgainstLiteralZero local_1a9;
  int *local_1a8;
  QFlags<QFileSystemMetaData::MetaDataFlag> *pQStack_1a0;
  QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4> local_180;
  QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4> local_17c;
  QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4> local_178;
  int local_174;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4> local_154;
  QMessageLogger local_150;
  QMessageLogger local_130;
  QFlags<QFileSystemMetaData::MetaDataFlag> local_10c;
  stat64 local_108;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QFileSystemEntry::isEmpty
                    ((QFileSystemEntry *)
                     CONCAT17(in_stack_fffffffffffffd77,
                              CONCAT16(in_stack_fffffffffffffd76,
                                       CONCAT15(in_stack_fffffffffffffd75,
                                                CONCAT14(in_stack_fffffffffffffd74,
                                                         in_stack_fffffffffffffd70)))));
  if (bVar1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
               CONCAT13(in_stack_fffffffffffffd77,
                        CONCAT12(in_stack_fffffffffffffd76,
                                 CONCAT11(in_stack_fffffffffffffd75,in_stack_fffffffffffffd74))),
               (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    QMessageLogger::warning(&local_130,"Empty filename passed to function");
    piVar6 = __errno_location();
    *piVar6 = 0x16;
    local_1e1 = false;
  }
  else {
    bVar1 = qIsFilenameBroken((QFileSystemEntry *)in_stack_fffffffffffffd80);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                 CONCAT13(in_stack_fffffffffffffd77,
                          CONCAT12(in_stack_fffffffffffffd76,
                                   CONCAT11(in_stack_fffffffffffffd75,in_stack_fffffffffffffd74))),
                 (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      QMessageLogger::warning(&local_150,"Broken filename passed to function");
      piVar6 = __errno_location();
      *piVar6 = 0x16;
      local_1e1 = false;
    }
    else {
      local_154.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
           (QFlagsStorage<QFileSystemMetaData::MetaDataFlag>)
           QFlags<QFileSystemMetaData::MetaDataFlag>::operator&
                     ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
                      CONCAT17(in_stack_fffffffffffffd77,
                               CONCAT16(in_stack_fffffffffffffd76,
                                        CONCAT15(in_stack_fffffffffffffd75,
                                                 CONCAT14(in_stack_fffffffffffffd74,
                                                          in_stack_fffffffffffffd70)))),
                      in_stack_fffffffffffffd6c);
      bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_154);
      if (bVar1) {
        QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=(&local_10c,PosixStatFlags);
      }
      QVar2 = QFlags<QFileSystemMetaData::MetaDataFlag>::operator~
                        ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
                         CONCAT17(in_stack_fffffffffffffd77,
                                  CONCAT16(in_stack_fffffffffffffd76,
                                           CONCAT15(in_stack_fffffffffffffd75,
                                                    CONCAT14(in_stack_fffffffffffffd74,
                                                             in_stack_fffffffffffffd70)))));
      QFlags<QFileSystemMetaData::MetaDataFlag>::operator&=(in_RSI + 1,QVar2);
      local_170 = &DAT_aaaaaaaaaaaaaaaa;
      local_168 = &DAT_aaaaaaaaaaaaaaaa;
      local_160 = &DAT_aaaaaaaaaaaaaaaa;
      QFileSystemEntry::nativeFilePath((QFileSystemEntry *)in_stack_fffffffffffffd78);
      local_174 = 0;
      memset(&local_108,0xaa,0x100);
      local_200 = -1;
      local_178.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
           (QFlagsStorage<QFileSystemMetaData::MetaDataFlag>)
           QFlags<QFileSystemMetaData::MetaDataFlag>::operator&
                     ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
                      CONCAT17(in_stack_fffffffffffffd77,
                               CONCAT16(in_stack_fffffffffffffd76,
                                        CONCAT15(in_stack_fffffffffffffd75,
                                                 CONCAT14(in_stack_fffffffffffffd74,
                                                          in_stack_fffffffffffffd70)))),
                      in_stack_fffffffffffffd6c);
      bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_178);
      if (bVar1) {
        local_204 = 0;
        QByteArray::operator_cast_to_char_((QByteArray *)0x69c43b);
        local_200 = qt_lstatx((char *)CONCAT17(in_stack_fffffffffffffd77,
                                               CONCAT16(in_stack_fffffffffffffd76,
                                                        CONCAT15(in_stack_fffffffffffffd75,
                                                                 CONCAT14(in_stack_fffffffffffffd74,
                                                                          in_stack_fffffffffffffd70)
                                                                ))),
                              (statx *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68)
                             );
        if (local_200 == -0x26) {
          pcVar5 = QByteArray::operator_cast_to_char_((QByteArray *)0x69c47c);
          local_200 = lstat64(pcVar5,&local_108);
          if (local_200 == 0) {
            local_204 = local_108.st_mode;
          }
        }
        else if (local_200 == 0) {
          local_200 = 1;
          local_204 = (uint)(ushort)local_108.st_uid;
        }
        if (local_200 < 0) {
          piVar6 = __errno_location();
          local_174 = *piVar6;
          QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=(in_RSI,ExistsAttribute);
        }
        else if ((local_204 & 0xf000) == 0xa000) {
          QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=(in_RSI + 1,LegacyLinkType);
          local_200 = -1;
        }
        else if (local_200 == 0) {
          QFileSystemMetaData::fillFromStatBuf
                    (in_stack_fffffffffffffd90,
                     (stat64 *)
                     CONCAT26(in_stack_fffffffffffffd8e.ucs,
                              CONCAT24(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)));
        }
        else {
          QFileSystemMetaData::fillFromStatxBuf(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78)
          ;
        }
        QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=(in_RSI,LegacyLinkType);
      }
      local_261 = false;
      if (local_200 == -1) {
        local_17c.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
             (QFlagsStorage<QFileSystemMetaData::MetaDataFlag>)
             QFlags<QFileSystemMetaData::MetaDataFlag>::operator&
                       ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
                        CONCAT17(in_stack_fffffffffffffd77,
                                 CONCAT16(in_stack_fffffffffffffd76,
                                          CONCAT15(in_stack_fffffffffffffd75,
                                                   CONCAT14(in_stack_fffffffffffffd74,
                                                            in_stack_fffffffffffffd70)))),
                        in_stack_fffffffffffffd6c);
        local_261 = ::QFlags::operator_cast_to_bool((QFlags *)&local_17c);
      }
      if (local_261 != false) {
        if ((local_174 == 0) && (local_200 == -1)) {
          MVar4 = ::operator~(CONCAT13(in_stack_fffffffffffffd77,
                                       CONCAT12(in_stack_fffffffffffffd76,
                                                CONCAT11(in_stack_fffffffffffffd75,
                                                         in_stack_fffffffffffffd74))));
          QFlags<QFileSystemMetaData::MetaDataFlag>::operator&=
                    (in_RSI + 1,
                     (QFlags<QFileSystemMetaData::MetaDataFlag>)
                     MVar4.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                     super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i);
          in_stack_fffffffffffffd90 =
               (QFileSystemMetaData *)QByteArray::operator_cast_to_char_((QByteArray *)0x69c646);
          local_200 = qt_statx((char *)CONCAT17(in_stack_fffffffffffffd77,
                                                CONCAT16(in_stack_fffffffffffffd76,
                                                         CONCAT15(in_stack_fffffffffffffd75,
                                                                  CONCAT14(in_stack_fffffffffffffd74
                                                                           ,
                                                  in_stack_fffffffffffffd70)))),
                               (statx *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68
                                                ));
          in_stack_fffffffffffffd8c = (undefined2)local_200;
          in_stack_fffffffffffffd8e.ucs = (char16_t)((uint)local_200 >> 0x10);
          if (local_200 == -0x26) {
            pcVar5 = QByteArray::operator_cast_to_char_((QByteArray *)0x69c687);
            local_200 = stat64(pcVar5,&local_108);
            if (local_200 == 0) {
              QFileSystemMetaData::fillFromStatBuf
                        (in_stack_fffffffffffffd90,
                         (stat64 *)
                         CONCAT26(in_stack_fffffffffffffd8e.ucs,
                                  CONCAT24(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)));
            }
          }
          else if (local_200 == 0) {
            QFileSystemMetaData::fillFromStatxBuf
                      (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
          }
        }
        if (local_200 != 0) {
          piVar6 = __errno_location();
          local_174 = *piVar6;
          *(undefined8 *)(in_RSI + 6) = 0;
          *(undefined8 *)(in_RSI + 8) = 0;
          *(undefined8 *)(in_RSI + 10) = 0;
          *(undefined8 *)(in_RSI + 4) = 0;
          *(undefined8 *)(in_RSI + 2) = 0;
          in_RSI[0xc].super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
          super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = 0xfffffffe;
          in_RSI[0xd].super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
          super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = 0xfffffffe;
          QVar2 = ::operator|(CONCAT13(in_stack_fffffffffffffd77,
                                       CONCAT12(in_stack_fffffffffffffd76,
                                                CONCAT11(in_stack_fffffffffffffd75,
                                                         in_stack_fffffffffffffd74))),
                              in_stack_fffffffffffffd70);
          QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=(in_RSI,QVar2);
        }
      }
      ::operator|(CONCAT13(in_stack_fffffffffffffd77,
                           CONCAT12(in_stack_fffffffffffffd76,
                                    CONCAT11(in_stack_fffffffffffffd75,in_stack_fffffffffffffd74))),
                  in_stack_fffffffffffffd70);
      local_180.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
           (QFlagsStorage<QFileSystemMetaData::MetaDataFlag>)
           QFlags<QFileSystemMetaData::MetaDataFlag>::operator&
                     ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
                      CONCAT17(in_stack_fffffffffffffd77,
                               CONCAT16(in_stack_fffffffffffffd76,
                                        CONCAT15(in_stack_fffffffffffffd75,
                                                 CONCAT14(in_stack_fffffffffffffd74,
                                                          in_stack_fffffffffffffd70)))),
                      (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
                      SUB84(in_stack_fffffffffffffd78,0));
      bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_180);
      if (bVar1) {
        local_1a8 = &local_174;
        pQStack_1a0 = &local_10c;
        fillMetaData::anon_class_32_4_8c4370f3::operator()
                  ((anon_class_32_4_8c4370f3 *)in_stack_fffffffffffffd90,
                   CONCAT22(in_stack_fffffffffffffd8e.ucs,in_stack_fffffffffffffd8c),
                   in_stack_fffffffffffffd88);
        fillMetaData::anon_class_32_4_8c4370f3::operator()
                  ((anon_class_32_4_8c4370f3 *)in_stack_fffffffffffffd90,
                   CONCAT22(in_stack_fffffffffffffd8e.ucs,in_stack_fffffffffffffd8c),
                   in_stack_fffffffffffffd88);
        fillMetaData::anon_class_32_4_8c4370f3::operator()
                  ((anon_class_32_4_8c4370f3 *)in_stack_fffffffffffffd90,
                   CONCAT22(in_stack_fffffffffffffd8e.ucs,in_stack_fffffffffffffd8c),
                   in_stack_fffffffffffffd88);
        if (local_174 == 0) {
          QVar2 = QFlags<QFileSystemMetaData::MetaDataFlag>::operator&
                            ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
                             CONCAT17(in_stack_fffffffffffffd77,
                                      CONCAT16(in_stack_fffffffffffffd76,
                                               CONCAT15(in_stack_fffffffffffffd75,
                                                        CONCAT14(in_stack_fffffffffffffd74,
                                                                 in_stack_fffffffffffffd70)))),
                             in_stack_fffffffffffffd6c);
          QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_1a9,0);
          bVar1 = ::operator==(QVar2.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>
                               .super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i);
          if (bVar1) {
            in_stack_fffffffffffffd78 =
                 (statx *)QByteArray::operator_cast_to_char_((QByteArray *)0x69c8fa);
            iVar3 = access((char *)in_stack_fffffffffffffd78,0);
            if (iVar3 == -1) {
              piVar6 = __errno_location();
              local_174 = *piVar6;
            }
            else {
              QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=(in_RSI + 1,ExistsAttribute);
            }
          }
        }
        local_1b0.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
             (QFlagsStorage<QFileSystemMetaData::MetaDataFlag>)
             QFlags<QFileSystemMetaData::MetaDataFlag>::operator&
                       ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
                        CONCAT17(in_stack_fffffffffffffd77,
                                 CONCAT16(in_stack_fffffffffffffd76,
                                          CONCAT15(in_stack_fffffffffffffd75,
                                                   CONCAT14(in_stack_fffffffffffffd74,
                                                            in_stack_fffffffffffffd70)))),
                        in_stack_fffffffffffffd6c);
        QVar2 = QFlags<QFileSystemMetaData::MetaDataFlag>::operator|
                          ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
                           CONCAT17(in_stack_fffffffffffffd77,
                                    CONCAT16(in_stack_fffffffffffffd76,
                                             CONCAT15(in_stack_fffffffffffffd75,
                                                      CONCAT14(in_stack_fffffffffffffd74,
                                                               in_stack_fffffffffffffd70)))),
                           in_stack_fffffffffffffd6c);
        QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=(in_RSI,QVar2);
      }
      local_1b4.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
           (QFlagsStorage<QFileSystemMetaData::MetaDataFlag>)
           QFlags<QFileSystemMetaData::MetaDataFlag>::operator&
                     ((QFlags<QFileSystemMetaData::MetaDataFlag> *)
                      CONCAT17(in_stack_fffffffffffffd77,
                               CONCAT16(in_stack_fffffffffffffd76,
                                        CONCAT15(in_stack_fffffffffffffd75,
                                                 CONCAT14(in_stack_fffffffffffffd74,
                                                          in_stack_fffffffffffffd70)))),
                      in_stack_fffffffffffffd6c);
      bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_1b4);
      bVar7 = 0;
      if (bVar1) {
        in_stack_fffffffffffffd76 = QFileSystemMetaData::isHidden((QFileSystemMetaData *)0x69c9bc);
        bVar7 = in_stack_fffffffffffffd76 ^ 0xff;
      }
      if ((bVar7 & 1) != 0) {
        local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_1d0 = &DAT_aaaaaaaaaaaaaaaa;
        local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
        QFileSystemEntry::fileName((QFileSystemEntry *)in_stack_fffffffffffffd78);
        QChar::QChar<char16_t,_true>(&local_1da,L'.');
        in_stack_fffffffffffffd75 =
             QString::startsWith((QString *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd8e,
                                 CONCAT13(bVar7,CONCAT12(in_stack_fffffffffffffd76,
                                                         CONCAT11(in_stack_fffffffffffffd75,
                                                                  in_stack_fffffffffffffd74))));
        if ((bool)in_stack_fffffffffffffd75) {
          QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=(in_RSI + 1,HiddenAttribute);
        }
        QFlags<QFileSystemMetaData::MetaDataFlag>::operator|=(in_RSI,HiddenAttribute);
        QString::~QString((QString *)0x69caae);
      }
      flags.i = (Int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
      local_1e1 = local_174 == 0;
      if (!local_1e1) {
        MVar4 = ::operator~(CONCAT13(bVar7,CONCAT12(in_stack_fffffffffffffd76,
                                                    CONCAT11(in_stack_fffffffffffffd75,
                                                             in_stack_fffffffffffffd74))));
        QFlags<QFileSystemMetaData::MetaDataFlag>::operator&=
                  (&local_10c,
                   (QFlags<QFileSystemMetaData::MetaDataFlag>)
                   MVar4.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                   super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i);
        QFileSystemMetaData::clearFlags
                  ((QFileSystemMetaData *)
                   CONCAT17(bVar7,CONCAT16(in_stack_fffffffffffffd76,
                                           CONCAT15(in_stack_fffffffffffffd75,
                                                    CONCAT14(in_stack_fffffffffffffd74,
                                                             in_stack_fffffffffffffd70)))),
                   (MetaDataFlags)flags.i);
      }
      QByteArray::~QByteArray((QByteArray *)0x69cb2a);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1e1;
}

Assistant:

bool QFileSystemEngine::fillMetaData(const QFileSystemEntry &entry, QFileSystemMetaData &data,
        QFileSystemMetaData::MetaDataFlags what)
{
    Q_CHECK_FILE_NAME(entry, false);

#if defined(Q_OS_DARWIN)
    if (what & (QFileSystemMetaData::BundleType | QFileSystemMetaData::CaseSensitive)) {
        if (!data.hasFlags(QFileSystemMetaData::DirectoryType))
            what |= QFileSystemMetaData::DirectoryType;
    }
    if (what & QFileSystemMetaData::AliasType)
        what |= QFileSystemMetaData::LinkType;
#endif
#ifdef UF_HIDDEN
    if (what & QFileSystemMetaData::HiddenAttribute) {
        // OS X >= 10.5: st_flags & UF_HIDDEN
        what |= QFileSystemMetaData::PosixStatFlags;
    }
#endif // defined(Q_OS_DARWIN)

    // if we're asking for any of the stat(2) flags, then we're getting them all
    if (what & QFileSystemMetaData::PosixStatFlags)
        what |= QFileSystemMetaData::PosixStatFlags;

    data.entryFlags &= ~what;

    const QByteArray nativeFilePath = entry.nativeFilePath();
    int entryErrno = 0; // innocent until proven otherwise

    // first, we may try lstat(2). Possible outcomes:
    //  - success and is a symlink: filesystem entry exists, but we need stat(2)
    //    -> statResult = -1;
    //  - success and is not a symlink: filesystem entry exists and we're done
    //    -> statResult = 0
    //  - failure: really non-existent filesystem entry
    //    -> entryExists = false; statResult = 0;
    //    both stat(2) and lstat(2) may generate a number of different errno
    //    conditions, but of those, the only ones that could happen and the
    //    entry still exist are EACCES, EFAULT, ENOMEM and EOVERFLOW. If we get
    //    EACCES or ENOMEM, then we have no choice on how to proceed, so we may
    //    as well conclude it doesn't exist; EFAULT can't happen and EOVERFLOW
    //    shouldn't happen because we build in _LARGEFIE64.
    union {
        QT_STATBUF statBuffer;
        struct statx statxBuffer;
    };
    int statResult = -1;
    if (what & QFileSystemMetaData::LinkType) {
        mode_t mode = 0;
        statResult = qt_lstatx(nativeFilePath, &statxBuffer);
        if (statResult == -ENOSYS) {
            // use lstst(2)
            statResult = QT_LSTAT(nativeFilePath, &statBuffer);
            if (statResult == 0)
                mode = statBuffer.st_mode;
        } else if (statResult == 0) {
            statResult = 1; // record it was statx(2) that succeeded
            mode = statxBuffer.stx_mode;
        }

        if (statResult >= 0) {
            if (S_ISLNK(mode)) {
               // it's a symlink, we don't know if the file "exists"
                data.entryFlags |= QFileSystemMetaData::LinkType;
                statResult = -1;    // force stat(2) below
            } else {
                // it's a reagular file and it exists
                if (statResult)
                    data.fillFromStatxBuf(statxBuffer);
                else
                    data.fillFromStatBuf(statBuffer);
            }
        } else {
            // it doesn't exist
            entryErrno = errno;
            data.knownFlagsMask |= QFileSystemMetaData::ExistsAttribute;
        }

        data.knownFlagsMask |= QFileSystemMetaData::LinkType;
    }

    // second, we try a regular stat(2)
    if (statResult == -1 && (what & QFileSystemMetaData::PosixStatFlags)) {
        if (entryErrno == 0 && statResult == -1) {
            data.entryFlags &= ~QFileSystemMetaData::PosixStatFlags;
            statResult = qt_statx(nativeFilePath, &statxBuffer);
            if (statResult == -ENOSYS) {
                // use stat(2)
                statResult = QT_STAT(nativeFilePath, &statBuffer);
                if (statResult == 0)
                    data.fillFromStatBuf(statBuffer);
            } else if (statResult == 0) {
                data.fillFromStatxBuf(statxBuffer);
            }
        }

        if (statResult != 0) {
            entryErrno = errno;
            data.birthTime_ = 0;
            data.metadataChangeTime_ = 0;
            data.modificationTime_ = 0;
            data.accessTime_ = 0;
            data.size_ = 0;
            data.userId_ = (uint) -2;
            data.groupId_ = (uint) -2;

            // reset the mask
            data.knownFlagsMask |= QFileSystemMetaData::PosixStatFlags
                | QFileSystemMetaData::ExistsAttribute;
        }
    }

    // third, we try access(2)
    if (what & (QFileSystemMetaData::UserPermissions | QFileSystemMetaData::ExistsAttribute)) {
#if defined(Q_OS_VXWORKS)
        // on VxWorks if the filesystem is not POSIX, access() always returns false, despite the
        // file is readable
        struct statfs statBuf;
        if (statfs(nativeFilePath, &statBuf) != 0) {
            what &= ~QFileSystemMetaData::LinkType; // don't clear link: could be broken symlink
            data.clearFlags(what);
            return false;
        }
        if (statBuf.f_type != NFSV2_MAGIC && statBuf.f_type != NFSV3_MAGIC &&
            statBuf.f_type != HRFS_MAGIC) {
#if __has_include(<dosFsLib.h>)
            if (data.entryFlags & QFileSystemMetaData::OwnerWritePermission) {
                data.entryFlags |= QFileSystemMetaData::UserWritePermission;
            }
            if (data.entryFlags & QFileSystemMetaData::OwnerExecutePermission) {
                data.entryFlags |= QFileSystemMetaData::UserExecutePermission;
            }
#endif
            data.entryFlags |= QFileSystemMetaData::UserReadPermission |
                    QFileSystemMetaData::ExistsAttribute;
            return true;
        }
#endif
        // calculate user permissions
        auto checkAccess = [&](QFileSystemMetaData::MetaDataFlag flag, int mode) {
            if (entryErrno != 0 || (what & flag) == 0)
                return;
            if (QT_ACCESS(nativeFilePath, mode) == 0) {
                // access ok (and file exists)
                data.entryFlags |= flag | QFileSystemMetaData::ExistsAttribute;
            } else if (errno != EACCES && errno != EROFS) {
                entryErrno = errno;
            }
        };
        checkAccess(QFileSystemMetaData::UserReadPermission, R_OK);
        checkAccess(QFileSystemMetaData::UserWritePermission, W_OK);
        checkAccess(QFileSystemMetaData::UserExecutePermission, X_OK);

        // if we still haven't found out if the file exists, try F_OK
        if (entryErrno == 0 && (data.entryFlags & QFileSystemMetaData::ExistsAttribute) == 0) {
            if (QT_ACCESS(nativeFilePath, F_OK) == -1)
                entryErrno = errno;
            else
                data.entryFlags |= QFileSystemMetaData::ExistsAttribute;
        }

        data.knownFlagsMask |= (what & QFileSystemMetaData::UserPermissions) |
                QFileSystemMetaData::ExistsAttribute;
    }

#if defined(Q_OS_DARWIN)
    if (what & QFileSystemMetaData::AliasType) {
        if (entryErrno == 0 && hasResourcePropertyFlag(data, entry, kCFURLIsAliasFileKey)) {
            // kCFURLIsAliasFileKey includes symbolic links, so filter those out
            if (!(data.entryFlags & QFileSystemMetaData::LinkType))
                data.entryFlags |= QFileSystemMetaData::AliasType;
        }
        data.knownFlagsMask |= QFileSystemMetaData::AliasType;
    }

    if (what & QFileSystemMetaData::BundleType) {
        if (entryErrno == 0 && isPackage(data, entry))
            data.entryFlags |= QFileSystemMetaData::BundleType;

        data.knownFlagsMask |= QFileSystemMetaData::BundleType;
    }

    if (what & QFileSystemMetaData::CaseSensitive) {
        if (entryErrno == 0 && hasResourcePropertyFlag(
            data, entry, kCFURLVolumeSupportsCaseSensitiveNamesKey))
            data.entryFlags |= QFileSystemMetaData::CaseSensitive;
        data.knownFlagsMask |= QFileSystemMetaData::CaseSensitive;
    }
#endif

    if (what & QFileSystemMetaData::HiddenAttribute
            && !data.isHidden()) {
        QString fileName = entry.fileName();
        if (fileName.startsWith(u'.')
#if defined(Q_OS_DARWIN)
                || (entryErrno == 0 && hasResourcePropertyFlag(data, entry, kCFURLIsHiddenKey))
#endif
                )
            data.entryFlags |= QFileSystemMetaData::HiddenAttribute;
        data.knownFlagsMask |= QFileSystemMetaData::HiddenAttribute;
    }

    if (entryErrno != 0) {
        what &= ~QFileSystemMetaData::LinkType; // don't clear link: could be broken symlink
        data.clearFlags(what);
        return false;
    }
    return true;
}